

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                  *this,parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
                        *container,MatchResultListener *listener)

{
  size_t sVar1;
  pointer pMVar2;
  unique_ptr<int,_std::default_delete<int>_> *extraout_RDX;
  unique_ptr<int,_std::default_delete<int>_> *value;
  unique_ptr<int,_std::default_delete<int>_> *extraout_RDX_00;
  pointer pMVar3;
  long lVar4;
  size_t sVar5;
  pointer pcVar6;
  long lVar7;
  bool bVar8;
  vector<char,_std::allocator<char>_> did_match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix matrix;
  DummyMatchResultListener dummy;
  allocator_type local_101;
  MatchResultListener *local_100;
  vector<char,_std::allocator<char>_> local_f8;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  size_t local_a0;
  MatchMatrix local_98;
  MatchResultListener local_70;
  const_iterator local_60;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar5 = 0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = listener;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::begin(&local_60,
          &container->
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         );
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_70.stream_ = (ostream *)0x0;
  local_70._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00271f70;
  if (local_60.iter_.inner_ != (Inner *)0x0) {
    sVar5 = 0;
    value = extraout_RDX;
    do {
      local_a0 = sVar5;
      if (local_100->stream_ != (ostream *)0x0) {
        PrintToString<std::unique_ptr<int,std::default_delete<int>>>
                  (&local_d8,(testing *)local_60.iter_.it_.field_1.slot_,value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   &local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_d8._M_dataplus._M_p._1_7_,local_d8._M_dataplus._M_p._0_1_) !=
            &local_d8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_d8._M_dataplus._M_p._1_7_,local_d8._M_dataplus._M_p._0_1_),
                          local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar3 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->matchers_).
          super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
        lVar4 = 0;
        lVar7 = 0;
        do {
          local_d8._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::MatchAndExplain
                         ((MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)
                          ((long)&(pMVar3->
                                  super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>
                                  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface
                          + lVar4),local_60.iter_.it_.field_1.slot_,&local_70);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_f8,(char *)&local_d8);
          lVar7 = lVar7 + 1;
          pMVar3 = (this->matchers_).
                   super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 0x18;
        } while (lVar7 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) *
                          -0x5555555555555555);
      }
      sVar5 = local_a0 + 1;
      phmap::priv::
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ::const_iterator::operator++(&local_60);
      value = extraout_RDX_00;
    } while (local_60.iter_.inner_ != (Inner *)0x0);
  }
  local_98.num_matchers_ =
       ((long)(this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_d8._M_dataplus._M_p._0_1_ = 0;
  local_98.num_elements_ = sVar5;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_98.matched_,local_98.num_matchers_ * sVar5,(value_type *)&local_d8,&local_101);
  if (sVar5 != 0) {
    pMVar2 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar3 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar1 = 0;
    pcVar6 = local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      bVar8 = pMVar3 != pMVar2;
      pMVar3 = pMVar2;
      if (bVar8) {
        lVar4 = 0;
        do {
          local_98.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4 + local_98.num_matchers_ * sVar1] =
               pcVar6[lVar4] != '\0';
          lVar4 = lVar4 + 1;
          pMVar2 = (this->matchers_).
                   super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar3 = (this->matchers_).
                   super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar4 != ((long)pMVar3 - (long)pMVar2 >> 3) * -0x5555555555555555);
        pcVar6 = pcVar6 + lVar4;
      }
      sVar1 = sVar1 + 1;
    } while (sVar1 != sVar5);
  }
  if (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  bVar8 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&local_b8,&local_98,local_100)
  ;
  if (bVar8) {
    bVar8 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&local_98,local_100);
  }
  else {
    bVar8 = false;
  }
  if (local_98.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return bVar8;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }